

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsRecord.cpp
# Opt level: O1

void __thiscall xmrig::DnsRecord::DnsRecord(DnsRecord *this,addrinfo *addr)

{
  int iVar1;
  char *str;
  
  iVar1 = addr->ai_family;
  this->m_type = (iVar1 == 10) + A;
  (this->m_ip).m_data = (char *)0x0;
  (this->m_ip).m_size = 0;
  if (iVar1 == 10) {
    str = (char *)operator_new__(0x2d);
    str[0x1d] = '\0';
    str[0x1e] = '\0';
    str[0x1f] = '\0';
    str[0x20] = '\0';
    str[0x21] = '\0';
    str[0x22] = '\0';
    str[0x23] = '\0';
    str[0x24] = '\0';
    str[0x25] = '\0';
    str[0x26] = '\0';
    str[0x27] = '\0';
    str[0x28] = '\0';
    str[0x29] = '\0';
    str[0x2a] = '\0';
    str[0x2b] = '\0';
    str[0x2c] = '\0';
    str[0x10] = '\0';
    str[0x11] = '\0';
    str[0x12] = '\0';
    str[0x13] = '\0';
    str[0x14] = '\0';
    str[0x15] = '\0';
    str[0x16] = '\0';
    str[0x17] = '\0';
    str[0x18] = '\0';
    str[0x19] = '\0';
    str[0x1a] = '\0';
    str[0x1b] = '\0';
    str[0x1c] = '\0';
    str[0x1d] = '\0';
    str[0x1e] = '\0';
    str[0x1f] = '\0';
    str[0] = '\0';
    str[1] = '\0';
    str[2] = '\0';
    str[3] = '\0';
    str[4] = '\0';
    str[5] = '\0';
    str[6] = '\0';
    str[7] = '\0';
    str[8] = '\0';
    str[9] = '\0';
    str[10] = '\0';
    str[0xb] = '\0';
    str[0xc] = '\0';
    str[0xd] = '\0';
    str[0xe] = '\0';
    str[0xf] = '\0';
    uv_ip6_name(addr->ai_addr,str,0x2d);
  }
  else {
    str = (char *)operator_new__(0x10);
    str[0] = '\0';
    str[1] = '\0';
    str[2] = '\0';
    str[3] = '\0';
    str[4] = '\0';
    str[5] = '\0';
    str[6] = '\0';
    str[7] = '\0';
    str[8] = '\0';
    str[9] = '\0';
    str[10] = '\0';
    str[0xb] = '\0';
    str[0xc] = '\0';
    str[0xd] = '\0';
    str[0xe] = '\0';
    str[0xf] = '\0';
    uv_ip4_name(addr->ai_addr,str,0x10);
  }
  String::move(&this->m_ip,str);
  return;
}

Assistant:

xmrig::DnsRecord::DnsRecord(const addrinfo *addr) :
    m_type(addr->ai_family == AF_INET6 ? AAAA : A)
{
    char *buf = nullptr;

    if (m_type == AAAA) {
        buf = new char[45]();
        uv_ip6_name(reinterpret_cast<sockaddr_in6*>(addr->ai_addr), buf, 45);
    }
    else {
        buf = new char[16]();
        uv_ip4_name(reinterpret_cast<sockaddr_in*>(addr->ai_addr), buf, 16);
    }

    m_ip = buf;
}